

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O3

int marktime(int *status)

{
  timeval tv;
  timeval local_20;
  
  time((time_t *)0x0);
  scpu = clock();
  start = time((time_t *)0x0);
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  startsec = local_20.tv_sec;
  startmilli = (int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_20.tv_usec),8) >> 7) -
               (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_20.tv_usec),0xc) >> 0x1f);
  return *status;
}

Assistant:

int marktime( int *status)
{
    double telapse;
    time_t temp;
    struct  timeval tv;

    temp = time(0);

    /* Since elapsed time is only measured to the nearest second */
    /* keep getting the time until the seconds tick just changes. */
    /* This provides more consistent timing measurements since the */
    /* intervals all start on an integer seconds. */

    telapse = 0.;

        scpu = clock();
        start = time(0);
/*
    while (telapse == 0.)
    {
        scpu = clock();
        start = time(0);
        telapse = difftime( start, temp );
    }
*/
        gettimeofday (&tv, NULL);

	startsec = tv.tv_sec;
        startmilli = tv.tv_usec/1000;

    return( *status );
}